

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O1

String testing::internal::FormatForComparisonFailureMessage<std::__cxx11::string,char[104]>
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
                 char (*param_2) [104])

{
  pointer __dest;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  String SVar2;
  string local_40;
  
  PrintToString<std::__cxx11::string>(&local_40,(testing *)param_2,in_RDX);
  __dest = (pointer)operator_new__(local_40._M_string_length + 1);
  memcpy(__dest,local_40._M_dataplus._M_p,local_40._M_string_length);
  __dest[local_40._M_string_length] = '\0';
  (value->_M_dataplus)._M_p = __dest;
  value->_M_string_length = local_40._M_string_length;
  sVar1 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    sVar1 = extraout_RDX_00;
  }
  SVar2.length_ = sVar1;
  SVar2.c_str_ = (char *)value;
  return SVar2;
}

Assistant:

String FormatForComparisonFailureMessage(const T1& value,
                                         const T2& /* other_operand */) {
  // C++Builder compiles this incorrectly if the namespace isn't explicitly
  // given.
  return ::testing::PrintToString(value);
}